

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucharstriebuilder.cpp
# Opt level: O3

int32_t __thiscall
icu_63::UCharsTrieBuilder::getLimitOfLinearMatch
          (UCharsTrieBuilder *this,int32_t first,int32_t last,int32_t unitIndex)

{
  ushort uVar1;
  uint uVar2;
  uint uVar3;
  char16_t cVar4;
  uint uVar5;
  char16_t cVar6;
  char16_t *pcVar7;
  uint uVar8;
  long lVar9;
  char16_t *pcVar10;
  uint uVar11;
  
  uVar2 = this->elements[first].stringOffset;
  uVar1 = (this->strings).fUnion.fStackFields.fLengthAndFlags;
  if ((short)uVar1 < 0) {
    uVar8 = *(uint *)((long)&(this->strings).fUnion + 4);
  }
  else {
    uVar8 = (int)(short)uVar1 >> 5;
  }
  if (uVar2 < uVar8) {
    pcVar10 = (this->strings).fUnion.fFields.fArray;
    pcVar7 = (char16_t *)((long)&(this->strings).fUnion + 2);
    if ((uVar1 & 2) == 0) {
      pcVar7 = pcVar10;
    }
    uVar5 = (uint)(ushort)pcVar7[(int)uVar2];
  }
  else {
    pcVar10 = (this->strings).fUnion.fFields.fArray;
    uVar5 = 0xffff;
  }
  pcVar7 = (char16_t *)((long)&(this->strings).fUnion + 2);
  if ((uVar1 & 2) == 0) {
    pcVar7 = pcVar10;
  }
  lVar9 = (long)unitIndex;
  uVar3 = unitIndex + 1U;
  if ((int)(unitIndex + 1U) < (int)uVar5) {
    uVar3 = uVar5;
  }
  do {
    lVar9 = lVar9 + 1;
    if ((long)(ulong)uVar5 <= lVar9) {
      return uVar3;
    }
    uVar11 = uVar2 + 2 + unitIndex;
    cVar4 = L'\xffff';
    cVar6 = L'\xffff';
    if (uVar11 < uVar8) {
      cVar6 = pcVar7[(int)uVar11];
    }
    uVar11 = this->elements[last].stringOffset + unitIndex + 2;
    if (uVar11 < uVar8) {
      cVar4 = pcVar7[(int)uVar11];
    }
    unitIndex = unitIndex + 1;
  } while (cVar6 == cVar4);
  return unitIndex;
}

Assistant:

int32_t
UCharsTrieBuilder::getLimitOfLinearMatch(int32_t first, int32_t last, int32_t unitIndex) const {
    const UCharsTrieElement &firstElement=elements[first];
    const UCharsTrieElement &lastElement=elements[last];
    int32_t minStringLength=firstElement.getStringLength(strings);
    while(++unitIndex<minStringLength &&
            firstElement.charAt(unitIndex, strings)==
            lastElement.charAt(unitIndex, strings)) {}
    return unitIndex;
}